

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O1

bool __thiscall
bssl::ParseValidity(bssl *this,Input validity_tlv,GeneralizedTime *not_before,
                   GeneralizedTime *not_after)

{
  bool bVar1;
  Input input;
  Parser validity_parser;
  Parser parser;
  Parser local_50;
  Parser local_38;
  
  input.data_.size_ = (size_t)validity_tlv.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser(&local_38,input);
  der::Parser::Parser(&local_50);
  bVar1 = der::Parser::ReadSequence(&local_38,&local_50);
  if ((((bVar1) &&
       (bVar1 = ReadUTCOrGeneralizedTime(&local_50,(GeneralizedTime *)validity_tlv.data_.size_),
       bVar1)) && (bVar1 = ReadUTCOrGeneralizedTime(&local_50,not_before), bVar1)) &&
     (bVar1 = der::Parser::HasMore(&local_38), !bVar1)) {
    bVar1 = der::Parser::HasMore(&local_50);
    return !bVar1;
  }
  return false;
}

Assistant:

bool ParseValidity(der::Input validity_tlv, der::GeneralizedTime *not_before,
                   der::GeneralizedTime *not_after) {
  der::Parser parser(validity_tlv);

  //     Validity ::= SEQUENCE {
  der::Parser validity_parser;
  if (!parser.ReadSequence(&validity_parser)) {
    return false;
  }

  //          notBefore      Time,
  if (!ReadUTCOrGeneralizedTime(&validity_parser, not_before)) {
    return false;
  }

  //          notAfter       Time }
  if (!ReadUTCOrGeneralizedTime(&validity_parser, not_after)) {
    return false;
  }

  // By definition the input was a single Validity sequence, so there shouldn't
  // be unconsumed data.
  if (parser.HasMore()) {
    return false;
  }

  // The Validity type does not have an extension point.
  if (validity_parser.HasMore()) {
    return false;
  }

  // Note that RFC 5280 doesn't require notBefore to be <=
  // notAfter, so that will not be considered a "parsing" error here. Instead it
  // will be considered an expired certificate later when testing against the
  // current timestamp.
  return true;
}